

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

void cuddZddSymmSummary(DdManager *table,int lower,int upper,int *symvars,int *symgroups)

{
  uint uVar1;
  int local_3c;
  int local_38;
  int TotalSymmGroups;
  int TotalSymm;
  int gbot;
  int x;
  int i;
  int *symgroups_local;
  int *symvars_local;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  local_38 = 0;
  local_3c = 0;
  for (gbot = lower; gbot <= upper; gbot = gbot + 1) {
    if (table->subtableZ[gbot].next != gbot) {
      local_3c = local_3c + 1;
      TotalSymm = gbot;
      uVar1 = TotalSymm;
      do {
        TotalSymm = uVar1;
        local_38 = local_38 + 1;
        uVar1 = table->subtableZ[TotalSymm].next;
      } while (uVar1 != gbot);
      gbot = TotalSymm;
    }
  }
  *symvars = local_38;
  *symgroups = local_3c;
  return;
}

Assistant:

static void
cuddZddSymmSummary(
  DdManager * table,
  int  lower,
  int  upper,
  int * symvars,
  int * symgroups)
{
    int i,x,gbot;
    int TotalSymm = 0;
    int TotalSymmGroups = 0;

    for (i = lower; i <= upper; i++) {
        if (table->subtableZ[i].next != (unsigned) i) {
            TotalSymmGroups++;
            x = i;
            do {
                TotalSymm++;
                gbot = x;
                x = table->subtableZ[x].next;
            } while (x != i);
#ifdef DD_DEBUG
            assert(table->subtableZ[gbot].next == (unsigned) i);
#endif
            i = gbot;
        }
    }
    *symvars = TotalSymm;
    *symgroups = TotalSymmGroups;

    return;

}